

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O3

Expression __thiscall
cnn::SimpleRNNBuilder::add_input_impl(SimpleRNNBuilder *this,int prev,Expression *in)

{
  undefined8 *puVar1;
  long lVar2;
  long *in_RCX;
  long lVar3;
  long lVar4;
  undefined4 in_register_00000034;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar8;
  Expression EVar9;
  Expression y;
  ComputationGraph *local_c0;
  uint local_b8;
  initializer_list<cnn::expr::Expression> local_b0;
  undefined1 local_a0 [16];
  pointer local_90;
  undefined4 local_88;
  ComputationGraph *local_80;
  uint local_78;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_70;
  initializer_list<cnn::expr::Expression> local_68;
  ulong local_58;
  SimpleRNNBuilder *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  lVar5 = CONCAT44(in_register_00000034,prev);
  lVar3 = *(long *)(lVar5 + 0x60);
  lVar4 = *(long *)(lVar5 + 0x58);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_a0,
             (ulong)*(uint *)(lVar5 + 0x88),(allocator_type *)&local_c0);
  local_70 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar5 + 0x58);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar5 + 0x58),
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_a0);
  if ((ComputationGraph *)local_a0._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_58 = (lVar3 - lVar4 >> 3) * -0x5555555555555555;
  if (*(int *)(lVar5 + 0x88) == 0) {
    lVar3 = *(long *)local_70;
    local_58 = local_58 & 0xffffffff;
  }
  else {
    local_a0._8_4_ = *(undefined4 *)(in_RCX + 1);
    local_a0._0_8_ = *in_RCX;
    local_58 = local_58 & 0xffffffff;
    local_40 = local_58 * 3;
    lVar7 = 8;
    lVar4 = 0;
    uVar6 = 0;
    local_48 = ((ulong)in & 0xffffffff) * 3;
    local_50 = this;
    local_38 = lVar5;
    do {
      lVar5 = local_38;
      lVar3 = *(long *)(local_38 + 0x40);
      puVar1 = *(undefined8 **)(lVar3 + lVar4);
      local_b0._M_array = (iterator)local_a0;
      local_90 = (pointer)*puVar1;
      local_88 = *(undefined4 *)(puVar1 + 1);
      local_b0._M_len = 3;
      local_80 = (ComputationGraph *)local_a0._0_8_;
      local_a0._0_8_ = (ComputationGraph *)puVar1[4];
      local_78 = local_a0._8_4_;
      local_a0._8_4_ = *(uint *)(puVar1 + 5);
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_c0,&local_b0);
      dVar8 = extraout_XMM0_Qa;
      if ((int)in == -1) {
        lVar2 = *(long *)(lVar5 + 0x70);
        if (*(long *)(lVar5 + 0x78) != lVar2) {
          local_90 = *(pointer *)(*(long *)(lVar3 + lVar4) + 0x10);
          local_88 = *(undefined4 *)(*(long *)(lVar3 + lVar4) + 0x18);
          goto LAB_0026489e;
        }
      }
      else if (-1 < (int)in) {
        local_90 = *(pointer *)(*(long *)(lVar3 + lVar4) + 0x10);
        local_88 = *(undefined4 *)(*(long *)(lVar3 + lVar4) + 0x18);
        lVar2 = *(long *)(*(long *)local_70 + local_48 * 8);
LAB_0026489e:
        local_a0._8_4_ = local_b8;
        local_a0._0_8_ = local_c0;
        local_68._M_array = (iterator)local_a0;
        local_80 = *(ComputationGraph **)(lVar2 + -8 + lVar7);
        local_78 = *(uint *)(lVar2 + lVar7);
        local_68._M_len = 3;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_b0,&local_68);
        local_c0 = (ComputationGraph *)local_b0._M_array;
        local_b8 = (uint)local_b0._M_len;
        dVar8 = extraout_XMM0_Qa_00;
      }
      expr::tanh((expr *)local_a0,dVar8);
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x18;
      lVar3 = *(long *)(local_38 + 0x58);
      lVar5 = *(long *)(lVar3 + local_40 * 8);
      *(undefined8 *)(lVar5 + -8 + lVar7) = local_a0._0_8_;
      *(undefined4 *)(lVar5 + lVar7) = local_a0._8_4_;
      lVar7 = lVar7 + 0x10;
      this = local_50;
    } while (uVar6 < *(uint *)(local_38 + 0x88));
  }
  lVar4 = *(long *)(lVar3 + 8 + local_58 * 0x18);
  (this->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar4 + -0x10);
  (this->super_RNNBuilder).cur.t = *(int *)(lVar4 + -8);
  EVar9._8_8_ = lVar3;
  EVar9.pg = (ComputationGraph *)this;
  return EVar9;
}

Assistant:

Expression SimpleRNNBuilder::add_input_impl(int prev, const Expression &in) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];

    // y <--- f(x)
    Expression y = affine_transform({vars[2], vars[0], x});

    // y <--- g(y_prev)
    if (prev == -1 && h0.size() > 0)
      y = affine_transform({y, vars[1], h0[i]});
    else if (prev >= 0)
      y = affine_transform({y, vars[1], h[prev][i]});

    // x <--- tanh(y)
    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}